

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport.c
# Opt level: O0

int tr_recv_all(tr_socket *socket,void *pdu,size_t len,time_t timeout)

{
  long in_FS_OFFSET;
  ulong uStack_50;
  int rtval;
  size_t total_recv;
  time_t timeout_local;
  size_t len_local;
  void *pdu_local;
  tr_socket *socket_local;
  long local_20;
  time_t cur_time;
  time_t end_time;
  
  end_time = *(time_t *)(in_FS_OFFSET + 0x28);
  uStack_50 = 0;
  lrtr_get_monotonic_time(&cur_time);
  cur_time = timeout + cur_time;
  for (; uStack_50 < len; uStack_50 = (long)socket_local._4_4_ + uStack_50) {
    lrtr_get_monotonic_time(&local_20);
    socket_local._4_4_ =
         tr_recv(socket,(void *)((long)pdu + uStack_50),len - uStack_50,cur_time - local_20);
    if (socket_local._4_4_ < 0) goto LAB_0010a87c;
  }
  socket_local._4_4_ = (int)uStack_50;
LAB_0010a87c:
  if (*(long *)(in_FS_OFFSET + 0x28) != end_time) {
    __stack_chk_fail();
  }
  return socket_local._4_4_;
}

Assistant:

int tr_recv_all(const struct tr_socket *socket, const void *pdu, const size_t len, const time_t timeout)
{
	size_t total_recv = 0;
	time_t end_time;

	lrtr_get_monotonic_time(&end_time);
	end_time += timeout;

	while (total_recv < len) {
		time_t cur_time;
		int rtval;

		lrtr_get_monotonic_time(&cur_time);

		rtval = tr_recv(socket, ((char *)pdu) + total_recv, (len - total_recv), end_time - cur_time);
		if (rtval < 0)
			return rtval;
		total_recv += rtval;
	}
	return total_recv;
}